

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::ReactionBlock::
ReactionBlock<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ReactionBlock *this,ControlRecord *cont,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  int in_stack_ffffffffffffffb8;
  
  readNC<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>,_std::allocator<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>_>_>
              *)&stack0xffffffffffffffb8,(ReactionBlock *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,MF,MT,
             (int)((_Head_base<4UL,_long,_false> *)
                  ((long)&(cont->
                          super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                          ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long>.
                          super__Tuple_impl<4UL,_long,_long> + 8))->_M_head_impl,
             in_stack_ffffffffffffffb8);
  ReactionBlock<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,cont,
             (vector<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>,_std::allocator<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>_>_>
              *)&stack0xffffffffffffffb8,begin,end,lineNumber,MAT,MF,MT);
  std::
  vector<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>,_std::allocator<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>_>_>
  ::~vector((vector<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>,_std::allocator<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>_>_>
             *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

ReactionBlock( ControlRecord&& cont,
               Iterator& begin,
               const Iterator& end,
               long& lineNumber,
               int MAT, int MF, int MT ) :
  ReactionBlock( std::move( cont ),
                 readNC( begin, end, lineNumber,
                         MAT, MF, MT, cont.N1() ),
                 begin, end, lineNumber, MAT, MF, MT ) {}